

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void __thiscall
kratos::LatchVisitor::AssignedVarVisitor::visit(AssignedVarVisitor *this,AssignStmt *stmt)

{
  Var *pVVar1;
  int iVar2;
  undefined4 extraout_var;
  vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *this_00;
  VarSlice *slice;
  AssignStmt *local_28;
  AssignStmt *stmt_local;
  Var *left;
  
  pVVar1 = stmt->left_;
  local_28 = stmt;
  stmt_local = (AssignStmt *)pVVar1;
  if (pVVar1->type_ == Slice) {
    iVar2 = (*(pVVar1->super_IRNode)._vptr_IRNode[0x2b])(pVVar1);
    if ((char)iVar2 != '\0') {
      return;
    }
    iVar2 = (*(pVVar1->super_IRNode)._vptr_IRNode[0x29])(pVVar1);
    stmt_local = (AssignStmt *)CONCAT44(extraout_var,iVar2);
  }
  this_00 = (vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)
            std::__detail::
            _Map_base<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->assigned_vars_,(key_type *)&stmt_local);
  std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::emplace_back<kratos::AssignStmt*&>
            (this_00,&local_28);
  return;
}

Assistant:

void visit(AssignStmt* stmt) override {
            auto* left = stmt->left();
            if (left->type() == VarType::Slice) {
                auto* slice = reinterpret_cast<VarSlice*>(left);
                if (slice->sliced_by_var()) {
                    return;
                }
                left = const_cast<Var*>(slice->get_var_root_parent());
            }
            assigned_vars_[left].emplace_back(stmt);
        }